

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.c
# Opt level: O1

int open_input(char *name)

{
  int iVar1;
  size_t sVar2;
  FILE *pFVar3;
  char *pcVar4;
  long lVar5;
  char temp [128];
  char acStack_a8 [4];
  undefined1 auStack_a4 [132];
  
  iVar1 = infile_num;
  lVar5 = (long)infile_num;
  if (lVar5 != 0) {
    if (infile_num == 7) {
      pcVar4 = "Too many include levels, max. 7!";
LAB_0010d2e2:
      error(pcVar4);
      return 1;
    }
    input_file[lVar5].lnum = slnum;
    input_file[lVar5].fp = in_fp;
  }
  strcpy(acStack_a8,name);
  pcVar4 = strrchr(acStack_a8,0x2e);
  if ((pcVar4 == (char *)0x0) || (pcVar4 = strchr(pcVar4,0x2f), pcVar4 != (char *)0x0)) {
    sVar2 = strlen(acStack_a8);
    builtin_strncpy(acStack_a8 + sVar2,".asm",4);
    auStack_a4[sVar2] = 0;
  }
  if (1 < iVar1) {
    lVar5 = lVar5 + -1;
    pcVar4 = input_file[1].name;
    do {
      iVar1 = strcmp(pcVar4,acStack_a8);
      if (iVar1 == 0) {
        pcVar4 = "Repeated include file!";
        goto LAB_0010d2e2;
      }
      pcVar4 = pcVar4 + 0x88;
      lVar5 = lVar5 + -1;
    } while (lVar5 != 0);
  }
  pFVar3 = open_file(acStack_a8,"r");
  if (pFVar3 == (FILE *)0x0) {
    iVar1 = -1;
  }
  else {
    slnum = 0;
    lVar5 = (long)infile_num;
    infile_num = (int)(lVar5 + 1U);
    in_fp = pFVar3;
    (input_file + 1)[lVar5].fp = pFVar3;
    (input_file + 1)[lVar5].if_level = if_level;
    strcpy((input_file + 1)[lVar5].name,acStack_a8);
    iVar1 = 0;
    if (((pass == 1) && (iVar1 = 0, xlist != 0)) && (list_level != 0)) {
      iVar1 = 0;
      fprintf((FILE *)lst_fp,"#[%i]   %s\n",lVar5 + 1U & 0xffffffff,(input_file + 1)[lVar5].name);
    }
  }
  return iVar1;
}

Assistant:

int
open_input(char *name)
{
	FILE *fp;
	char *p;
	char  temp[128];
	int   i;

	/* only 7 nested input files */
	if (infile_num == 7) {
		error("Too many include levels, max. 7!");
		return (1);
	}

	/* backup current input file infos */
	if (infile_num) {
		input_file[infile_num].lnum = slnum;
		input_file[infile_num].fp = in_fp;
	}				

	/* get a copy of the file name */
	strcpy(temp, name);

	/* auto add the .asm file extension */
	if ((p = strrchr(temp, '.')) != NULL) {
		if (strchr(p, PATH_SEPARATOR))
			strcat(temp, ".asm");
	}
	else {
		strcat(temp, ".asm");
	}

	/* check if this file is already opened */
	if (infile_num) {
		for (i = 1; i < infile_num; i++) {
			if (!strcmp(input_file[i].name, temp)) {
				error("Repeated include file!");
				return (1);
			}
		}
	}				

	/* open the file */
	if ((fp = open_file(temp, "r")) == NULL)
		return (-1);

	/* update input file infos */
	in_fp = fp;
	slnum = 0;
	infile_num++;
	input_file[infile_num].fp = fp;
	input_file[infile_num].if_level = if_level;
	strcpy(input_file[infile_num].name, temp);
	if ((pass == LAST_PASS) && (xlist) && (list_level))
		fprintf(lst_fp, "#[%i]   %s\n", infile_num, input_file[infile_num].name);

	/* ok */
	return (0);
}